

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConvexDecomposition.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChConvexDecompositionHACD::GetConvexHullResult
          (ChConvexDecompositionHACD *this,uint hullIndex,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *convexhull)

{
  Vec3<double> *points;
  ulong uVar1;
  pointer pCVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong numCH;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  size_t *psVar10;
  size_t *psVar11;
  ulong uVar12;
  ulong uVar13;
  value_type local_48;
  
  numCH = (ulong)hullIndex;
  uVar1 = this->myHACD->m_nClusters;
  if (numCH <= uVar1) {
    sVar6 = HACD::HACD::GetNPointsCH(this->myHACD,numCH);
    sVar7 = HACD::HACD::GetNTrianglesCH(this->myHACD,numCH);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = sVar7;
    uVar8 = SUB168(auVar3 * ZEXT816(0x18),0);
    uVar13 = 0xffffffffffffffff;
    uVar12 = uVar8 + 8;
    if (0xfffffffffffffff7 < uVar8) {
      uVar12 = uVar13;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = sVar6;
    uVar8 = SUB168(auVar4 * ZEXT816(0x18),0);
    if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
      uVar12 = uVar13;
    }
    uVar9 = uVar8 + 8;
    if (0xfffffffffffffff7 < uVar8) {
      uVar9 = uVar13;
    }
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar13 = uVar9;
    }
    psVar10 = (size_t *)operator_new__(uVar13);
    *psVar10 = sVar6;
    points = (Vec3<double> *)(psVar10 + 1);
    psVar11 = (size_t *)operator_new__(uVar12);
    *psVar11 = sVar7;
    HACD::HACD::GetCH(this->myHACD,numCH,points,(Vec3<long> *)(psVar11 + 1));
    pCVar2 = (convexhull->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((convexhull->
        super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
      (convexhull->
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = pCVar2;
    }
    for (uVar5 = 0; uVar13 = (ulong)uVar5, uVar13 < sVar6; uVar5 = uVar5 + 1) {
      local_48.m_data[0] = points[uVar13].m_data[0];
      local_48.m_data[1] = points[uVar13].m_data[1];
      local_48.m_data[2] = (double)psVar10[uVar13 * 3 + 3];
      std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::push_back
                (convexhull,&local_48);
    }
    operator_delete__(psVar10,*psVar10 * 0x18 + 8);
    operator_delete__(psVar11,*psVar11 * 0x18 + 8);
  }
  return numCH <= uVar1;
}

Assistant:

bool ChConvexDecompositionHACD::GetConvexHullResult(unsigned int hullIndex,
                                                    std::vector<ChVector<double> >& convexhull) {
    if (hullIndex > myHACD->GetNClusters())
        return false;

    size_t nPoints = myHACD->GetNPointsCH(hullIndex);
    size_t nTriangles = myHACD->GetNTrianglesCH(hullIndex);

    HACD::Vec3<HACD::Real>* pointsCH = new HACD::Vec3<HACD::Real>[nPoints];
    HACD::Vec3<long>* trianglesCH = new HACD::Vec3<long>[nTriangles];
    myHACD->GetCH(hullIndex, pointsCH, trianglesCH);

    // convert to chrono data...
    convexhull.clear();
    for (unsigned int i = 0; i < nPoints; i++) {
        ChVector<double> point(pointsCH[i].X(), pointsCH[i].Y(), pointsCH[i].Z());
        convexhull.push_back(point);
    }

    delete[] pointsCH;
    delete[] trianglesCH;

    return true;
}